

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throwable.cc
# Opt level: O3

void xemmai::t_backtrace::f_push(t_object *a_throwable,t_object *a_lambda,void **a_pc)

{
  long *plVar1;
  long lVar2;
  bool bVar4;
  long lVar3;
  
  plVar1 = (long *)operator_new(0x18);
  *plVar1 = *(long *)(a_throwable->v_data + 8);
  t_slot::t_slot((t_slot *)(plVar1 + 1),a_lambda);
  plVar1[2] = (long)a_pc;
  lVar3 = *plVar1;
  while( true ) {
    LOCK();
    lVar2 = *(long *)(a_throwable->v_data + 8);
    bVar4 = lVar3 == lVar2;
    if (bVar4) {
      *(long **)(a_throwable->v_data + 8) = plVar1;
      lVar2 = lVar3;
    }
    UNLOCK();
    if (bVar4) break;
    *plVar1 = lVar2;
    lVar3 = lVar2;
  }
  return;
}

Assistant:

void t_backtrace::f_push(t_object* a_throwable, t_object* a_lambda, void** a_pc)
{
	auto& head = a_throwable->f_as<t_throwable>().v_backtrace;
	auto p = new t_backtrace(head.load(std::memory_order_relaxed), a_lambda, a_pc);
	while (!head.compare_exchange_weak(p->v_next, p, std::memory_order_release, std::memory_order_relaxed));
}